

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::LongNameHandler::multiSimpleFormatsToModifiers
          (LongNameHandler *this,UnicodeString *leadFormats,UnicodeString *trailFormat,Field field,
          UErrorCode *status)

{
  long lVar1;
  undefined8 *puVar2;
  UnicodeString compoundFormat;
  UnicodeString leadFormat;
  SimpleFormatter compoundCompiled;
  SimpleFormatter trailCompiled;
  Parameters local_1c0;
  UnicodeString local_1b0;
  UnicodeString local_170;
  SimpleFormatter local_130;
  SimpleFormatter local_e8;
  SimpleModifier local_a0;
  
  SimpleFormatter::SimpleFormatter(&local_e8,trailFormat,1,1,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    puVar2 = (undefined8 *)&this->field_0x58;
    lVar1 = 0;
    do {
      anon_unknown.dwarf_1b0b9b::getWithPlural(&local_170,leadFormats,(Form)lVar1,status);
      if (U_ZERO_ERROR < *status) {
LAB_002a57ed:
        icu_63::UnicodeString::~UnicodeString(&local_170);
        break;
      }
      local_1b0.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_00487e70;
      local_1b0.fUnion.fStackFields.fLengthAndFlags = 2;
      SimpleFormatter::format(&local_e8,&local_170,&local_1b0,status);
      if (U_ZERO_ERROR < *status) {
LAB_002a57e3:
        icu_63::UnicodeString::~UnicodeString(&local_1b0);
        goto LAB_002a57ed;
      }
      SimpleFormatter::SimpleFormatter(&local_130,&local_1b0,0,1,status);
      if (U_ZERO_ERROR < *status) {
        SimpleFormatter::~SimpleFormatter(&local_130);
        goto LAB_002a57e3;
      }
      Modifier::Parameters::Parameters(&local_1c0,&this->super_ModifierStore,'\0',(Form)lVar1);
      SimpleModifier::SimpleModifier(&local_a0,&local_130,field,false,local_1c0);
      icu_63::UnicodeString::moveFrom((UnicodeString *)(puVar2 + -8),&local_a0.fCompiledPattern);
      *puVar2 = local_a0._72_8_;
      puVar2[1] = local_a0._80_8_;
      puVar2[2] = local_a0._88_8_;
      puVar2[3] = local_a0.fParameters.obj;
      puVar2[4] = local_a0.fParameters._8_8_;
      local_a0.super_Modifier._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_004771b8;
      icu_63::UnicodeString::~UnicodeString(&local_a0.fCompiledPattern);
      Modifier::~Modifier(&local_a0.super_Modifier);
      SimpleFormatter::~SimpleFormatter(&local_130);
      icu_63::UnicodeString::~UnicodeString(&local_1b0);
      icu_63::UnicodeString::~UnicodeString(&local_170);
      lVar1 = lVar1 + 1;
      puVar2 = puVar2 + 0xe;
    } while (lVar1 != 6);
  }
  SimpleFormatter::~SimpleFormatter(&local_e8);
  return;
}

Assistant:

void LongNameHandler::multiSimpleFormatsToModifiers(const UnicodeString *leadFormats, UnicodeString trailFormat,
                                                    Field field, UErrorCode &status) {
    SimpleFormatter trailCompiled(trailFormat, 1, 1, status);
    if (U_FAILURE(status)) { return; }
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        StandardPlural::Form plural = static_cast<StandardPlural::Form>(i);
        UnicodeString leadFormat = getWithPlural(leadFormats, plural, status);
        if (U_FAILURE(status)) { return; }
        UnicodeString compoundFormat;
        trailCompiled.format(leadFormat, compoundFormat, status);
        if (U_FAILURE(status)) { return; }
        SimpleFormatter compoundCompiled(compoundFormat, 0, 1, status);
        if (U_FAILURE(status)) { return; }
        fModifiers[i] = SimpleModifier(compoundCompiled, field, false, {this, 0, plural});
    }
}